

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::step_push
          (xpath_ast_node *this,xpath_node_set_raw *ns,xml_attribute *a,xml_node *parent,
          xpath_allocator *alloc)

{
  char *pcVar1;
  char cVar2;
  char_t *pcVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  char *src;
  bool bVar7;
  xpath_node local_30;
  
  if (a->_attr != (xml_attribute_struct *)0x0) {
    pcVar3 = a->_attr->name;
    src = "";
    if (pcVar3 != (char_t *)0x0) {
      src = pcVar3;
    }
    if (*src == 'x') {
      lVar6 = 0;
      do {
        lVar4 = lVar6 + 1;
        if (lVar6 == 4) break;
        lVar5 = lVar6 + 1;
        lVar6 = lVar6 + 1;
      } while (src[lVar5] == "xmlns"[lVar4]);
      if ("xmlns"[lVar4] == '\0') {
        if (src[5] == '\0') {
          return;
        }
        if (src[5] == ':') {
          return;
        }
      }
    }
    switch(this->_test) {
    case '\x01':
      bVar7 = strequal(src,(this->_data).string);
      if (!bVar7) {
        return;
      }
      local_30._attribute = (xml_attribute)a->_attr;
      local_30._node._root = (xml_node_struct *)local_30._attribute._attr;
      if ((xml_node_struct *)local_30._attribute._attr != (xml_node_struct *)0x0) {
        local_30._node = (xml_node)parent->_root;
      }
      break;
    default:
      goto switchD_0012366b_caseD_3;
    case '\b':
      cVar2 = *(this->_data).string;
      bVar7 = cVar2 == '\0';
      if ((!bVar7) && (*src == cVar2)) {
        lVar6 = 1;
        do {
          cVar2 = (this->_data).string[lVar6];
          bVar7 = cVar2 == '\0';
          if (bVar7) break;
          pcVar1 = src + lVar6;
          lVar6 = lVar6 + 1;
        } while (*pcVar1 == cVar2);
      }
      if (!bVar7) {
        return;
      }
    case '\x02':
    case '\a':
      local_30._attribute = (xml_attribute)a->_attr;
      local_30._node._root = parent->_root;
    }
    xpath_node_set_raw::push_back(ns,&local_30,alloc);
  }
switchD_0012366b_caseD_3:
  return;
}

Assistant:

void step_push(xpath_node_set_raw& ns, const xml_attribute& a, const xml_node& parent, xpath_allocator* alloc)
		{
			if (!a) return;

			const char_t* name = a.name();

			// There are no attribute nodes corresponding to attributes that declare namespaces
			// That is, "xmlns:..." or "xmlns"
			if (starts_with(name, PUGIXML_TEXT("xmlns")) && (name[5] == 0 || name[5] == ':')) return;
			
			switch (_test)
			{
			case nodetest_name:
				if (strequal(name, _data.nodetest)) ns.push_back(xpath_node(a, parent), alloc);
				break;
				
			case nodetest_type_node:
			case nodetest_all:
				ns.push_back(xpath_node(a, parent), alloc);
				break;
				
			case nodetest_all_in_namespace:
				if (starts_with(name, _data.nodetest))
					ns.push_back(xpath_node(a, parent), alloc);
				break;
			
			default:
				;
			}
		}